

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::FindEntryWithKey<Js::InternalString>
          (BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,InternalString *key)

{
  Type piVar1;
  Type pSVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  char16_t *string2;
  uint uVar7;
  hash_t hashCode;
  char16_t *string1;
  Type this_00;
  
  piVar1 = this->buckets;
  uVar3 = 0;
  if (piVar1 != (Type)0x0) {
    if ((ulong)key->m_charLength == 0) {
      hashCode = 0x2393b8b;
    }
    else {
      uVar6 = 0x811c9dc5;
      uVar5 = 0;
      do {
        uVar7 = *(ushort *)
                 ((long)(key->m_content).ptr + uVar5 * 2 + (ulong)((uint)key->m_offset * 2)) ^ uVar6
        ;
        uVar6 = uVar7 * 0x1000193;
        uVar5 = uVar5 + 1;
      } while (key->m_charLength != uVar5);
      hashCode = uVar7 * 0x2000326 + 1;
    }
    uVar3 = GetBucket(hashCode,this->bucketCount,this->modFunctionIndex);
    uVar6 = piVar1[uVar3];
    uVar3 = 0;
    if (-1 < (int)uVar6) {
      pSVar2 = this->entries;
      uVar3 = 0;
      do {
        uVar7 = pSVar2[uVar6].
                super_DefaultHashedEntry<Js::InternalString,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<Js::InternalString,_Value_*>.
                super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_Value_*>_>
                .super_KeyValueEntryDataLayout2<Js::InternalString,_Value_*>.key.m_charLength;
        if (uVar7 == key->m_charLength) {
          string1 = (char16_t *)
                    ((ulong)((uint)pSVar2[uVar6].
                                   super_DefaultHashedEntry<Js::InternalString,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                   .super_KeyValueEntry<Js::InternalString,_Value_*>.
                                   super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_Value_*>_>
                                   .super_KeyValueEntryDataLayout2<Js::InternalString,_Value_*>.key.
                                   m_offset * 2) +
                    (long)pSVar2[uVar6].
                          super_DefaultHashedEntry<Js::InternalString,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                          .super_KeyValueEntry<Js::InternalString,_Value_*>.
                          super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_Value_*>_>
                          .super_KeyValueEntryDataLayout2<Js::InternalString,_Value_*>.key.m_content
                          .ptr);
          string2 = (char16_t *)((ulong)((uint)key->m_offset * 2) + (long)(key->m_content).ptr);
          if (string1 != string2) {
            iVar4 = PAL_wmemcmp(string1,string2,(ulong)uVar7);
            if (iVar4 != 0) goto LAB_004806b5;
          }
          this_00 = this->stats;
          goto LAB_004806ce;
        }
LAB_004806b5:
        uVar3 = uVar3 + 1;
        uVar6 = pSVar2[uVar6].
                super_DefaultHashedEntry<Js::InternalString,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<Js::InternalString,_Value_*>.
                super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_Value_*>_>
                .super_KeyValueEntryDataLayout2<Js::InternalString,_Value_*>.next;
      } while (-1 < (int)uVar6);
    }
  }
  this_00 = this->stats;
  uVar6 = 0xffffffff;
LAB_004806ce:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar3);
  }
  return uVar6;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }